

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O0

void __thiscall
cmGeneratorExpressionDAGChecker::ReportError
          (cmGeneratorExpressionDAGChecker *this,cmGeneratorExpressionContext *context,string *expr)

{
  ostream *poVar1;
  string *psVar2;
  cmake *pcVar3;
  string local_528;
  string local_508;
  ostringstream local_4e8 [8];
  ostringstream e_2;
  int local_36c;
  undefined1 local_368 [4];
  int loopStep;
  ostringstream local_348 [8];
  ostringstream e_1;
  string local_1d0;
  ostringstream local_1a0 [8];
  ostringstream e;
  cmGeneratorExpressionDAGChecker *local_28;
  cmGeneratorExpressionDAGChecker *parent;
  string *expr_local;
  cmGeneratorExpressionContext *context_local;
  cmGeneratorExpressionDAGChecker *this_local;
  
  if ((this->CheckResult != DAG) && (context->HadError = true, (context->Quiet & 1U) == 0)) {
    local_28 = this->Parent;
    if ((local_28 == (cmGeneratorExpressionDAGChecker *)0x0) ||
       (local_28->Parent != (cmGeneratorExpressionDAGChecker *)0x0)) {
      std::__cxx11::ostringstream::ostringstream(local_348);
      poVar1 = std::operator<<((ostream *)local_348,"Error evaluating generator expression:\n");
      poVar1 = std::operator<<(poVar1,"  ");
      poVar1 = std::operator<<(poVar1,(string *)expr);
      poVar1 = std::operator<<(poVar1,"\n");
      std::operator<<(poVar1,"Dependency loop found.");
      pcVar3 = cmLocalGenerator::GetCMakeInstance(context->LG);
      std::__cxx11::ostringstream::str();
      cmake::IssueMessage(pcVar3,FATAL_ERROR,(string *)local_368,&context->Backtrace,false);
      std::__cxx11::string::~string((string *)local_368);
      std::__cxx11::ostringstream::~ostringstream(local_348);
      local_36c = 1;
      while (local_28 != (cmGeneratorExpressionDAGChecker *)0x0) {
        std::__cxx11::ostringstream::ostringstream(local_4e8);
        poVar1 = std::operator<<((ostream *)local_4e8,"Loop step ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_36c);
        poVar1 = std::operator<<(poVar1,"\n");
        poVar1 = std::operator<<(poVar1,"  ");
        if (local_28->Content == (GeneratorExpressionContent *)0x0) {
          std::__cxx11::string::string((string *)&local_508,(string *)expr);
        }
        else {
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_508,local_28->Content)
          ;
        }
        poVar1 = std::operator<<(poVar1,(string *)&local_508);
        std::operator<<(poVar1,"\n");
        std::__cxx11::string::~string((string *)&local_508);
        pcVar3 = cmLocalGenerator::GetCMakeInstance(context->LG);
        std::__cxx11::ostringstream::str();
        cmake::IssueMessage(pcVar3,FATAL_ERROR,&local_528,&local_28->Backtrace,false);
        std::__cxx11::string::~string((string *)&local_528);
        local_28 = local_28->Parent;
        local_36c = local_36c + 1;
        std::__cxx11::ostringstream::~ostringstream(local_4e8);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1a0);
      poVar1 = std::operator<<((ostream *)local_1a0,"Error evaluating generator expression:\n");
      poVar1 = std::operator<<(poVar1,"  ");
      poVar1 = std::operator<<(poVar1,(string *)expr);
      poVar1 = std::operator<<(poVar1,"\n");
      poVar1 = std::operator<<(poVar1,"Self reference on target \"");
      psVar2 = cmGeneratorTarget::GetName_abi_cxx11_(context->HeadTarget);
      poVar1 = std::operator<<(poVar1,(string *)psVar2);
      std::operator<<(poVar1,"\".\n");
      pcVar3 = cmLocalGenerator::GetCMakeInstance(context->LG);
      std::__cxx11::ostringstream::str();
      cmake::IssueMessage(pcVar3,FATAL_ERROR,&local_1d0,&local_28->Backtrace,false);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::ostringstream::~ostringstream(local_1a0);
    }
  }
  return;
}

Assistant:

void cmGeneratorExpressionDAGChecker::ReportError(
                  cmGeneratorExpressionContext *context,
                  const std::string &expr)
{
  if (this->CheckResult == DAG)
    {
    return;
    }

  context->HadError = true;
  if (context->Quiet)
    {
    return;
    }

  const cmGeneratorExpressionDAGChecker *parent = this->Parent;

  if (parent && !parent->Parent)
    {
    std::ostringstream e;
    e << "Error evaluating generator expression:\n"
      << "  " << expr << "\n"
      << "Self reference on target \""
      << context->HeadTarget->GetName() << "\".\n";
    context->LG->GetCMakeInstance()
      ->IssueMessage(cmake::FATAL_ERROR, e.str(),
                      parent->Backtrace);
    return;
    }

  {
  std::ostringstream e;
  e << "Error evaluating generator expression:\n"
    << "  " << expr << "\n"
    << "Dependency loop found.";
  context->LG->GetCMakeInstance()
    ->IssueMessage(cmake::FATAL_ERROR, e.str(),
                    context->Backtrace);
  }

  int loopStep = 1;
  while (parent)
    {
    std::ostringstream e;
    e << "Loop step " << loopStep << "\n"
      << "  "
      << (parent->Content ? parent->Content->GetOriginalExpression() : expr)
      << "\n";
    context->LG->GetCMakeInstance()
      ->IssueMessage(cmake::FATAL_ERROR, e.str(),
                      parent->Backtrace);
    parent = parent->Parent;
    ++loopStep;
    }
}